

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChPhysicsItem.h
# Opt level: O0

void __thiscall
chrono::ChPhysicsItem::IntStateIncrement
          (ChPhysicsItem *this,uint off_x,ChState *x_new,ChState *x,uint off_v,ChStateDelta *Dv)

{
  double dVar1;
  double dVar2;
  int iVar3;
  CoeffReturnType pdVar4;
  Scalar *pSVar5;
  undefined4 local_3c;
  int i;
  ChStateDelta *Dv_local;
  uint off_v_local;
  ChState *x_local;
  ChState *x_new_local;
  uint off_x_local;
  ChPhysicsItem *this_local;
  
  local_3c = 0;
  while( true ) {
    iVar3 = (**(code **)(*(long *)this + 0xb0))();
    if (iVar3 <= local_3c) break;
    pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)x,
                        (ulong)(off_x + local_3c));
    dVar1 = *pdVar4;
    pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)Dv,
                        (ulong)(off_v + local_3c));
    dVar2 = *pdVar4;
    pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)x_new,
                        (ulong)(off_x + local_3c));
    *pSVar5 = dVar1 + dVar2;
    local_3c = local_3c + 1;
  }
  return;
}

Assistant:

virtual void IntStateIncrement(const unsigned int off_x,  ///< offset in x state vector
                                   ChState& x_new,            ///< state vector, position part, incremented result
                                   const ChState& x,          ///< state vector, initial position part
                                   const unsigned int off_v,  ///< offset in v state vector
                                   const ChStateDelta& Dv     ///< state vector, increment
    ) {
        for (int i = 0; i < GetDOF(); ++i) {
            x_new(off_x + i) = x(off_x + i) + Dv(off_v + i);
        }
    }